

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O3

void __thiscall
DefaultIndexFixture_UpsertInternalStore_Test::TestBody
          (DefaultIndexFixture_UpsertInternalStore_Test *this)

{
  database *db;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  uint generation;
  value_reference_type ppVar1;
  char *pcVar2;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  transaction_type t1;
  AssertHelper local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d8;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  _Alloc_hider local_3a0;
  size_type local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  AssertHelper local_380;
  undefined8 local_378;
  undefined1 local_370 [24];
  _Alloc_hider local_358;
  undefined1 local_350 [8];
  undefined1 local_348 [24];
  _Alloc_hider local_330;
  index_pointer local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320 [11];
  _Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  local_268;
  bool local_260;
  transaction<std::unique_lock<mock_mutex>_> local_258;
  undefined1 local_220 [232];
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_138;
  bool local_130;
  undefined1 local_128 [232];
  _Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  local_40;
  bool local_38;
  
  db = &(this->super_DefaultIndexFixture).super_IndexFixture.db_;
  local_128._0_8_ = &(this->super_DefaultIndexFixture).super_IndexFixture.field_0x10;
  local_128[8] = false;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_128);
  local_128[8] = true;
  local_358._M_p = (pointer)db;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_258,db,(unique_lock<mock_mutex> *)local_128);
  pcVar3 = local_348 + 8;
  local_348[9] = '\0';
  local_3c0 = (undefined1  [8])&local_3b0;
  local_3b0._M_local_buf[1] = '\0';
  local_220._16_2_ = 0x61;
  local_220._18_6_ = local_348._10_6_;
  local_220._26_4_ = local_348._18_4_;
  local_220._30_2_ = local_348._22_2_;
  local_220._8_8_ = (index_pointer)0x1;
  local_348._0_8_ = 0;
  local_348[8] = '\0';
  local_220._48_8_ = CONCAT62(local_3b0._M_allocated_capacity._2_6_,0x62);
  local_220._40_8_ = (index_pointer)0x1;
  local_3b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3b0._M_local_buf[0] = '\0';
  local_350 = (undefined1  [8])pcVar3;
  local_220._0_8_ = local_220 + 0x10;
  local_220._32_8_ = local_220 + 0x30;
  pstore::index::
  hamt_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
  ::insert_or_upsert<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)local_128,
             (hamt_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
              *)(this->super_DefaultIndexFixture).index_._M_t.
                super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
                ._M_head_impl,&local_258.super_transaction_base,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_220,true);
  if ((undefined1 *)local_220._32_8_ != local_220 + 0x30) {
    operator_delete((void *)local_220._32_8_,local_220._48_8_ + 1);
  }
  if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
    operator_delete((void *)local_220._0_8_,CONCAT62(local_220._18_6_,local_220._16_2_) + 1);
  }
  if (local_3c0 != (undefined1  [8])&local_3b0) {
    operator_delete((void *)local_3c0,
                    CONCAT62(local_3b0._M_allocated_capacity._2_6_,
                             CONCAT11(local_3b0._M_local_buf[1],local_3b0._M_local_buf[0])) + 1);
  }
  if (local_350 != (undefined1  [8])pcVar3) {
    operator_delete((void *)local_350,
                    CONCAT62(local_348._10_6_,CONCAT11(local_348[9],local_348[8])) + 1);
  }
  local_3b0._M_local_buf[1] = '\0';
  local_3d0[1] = 0;
  local_348[8] = 'c';
  local_348[9] = '\0';
  local_348._10_6_ = local_3b0._M_allocated_capacity._2_6_;
  local_348._18_4_ = local_3b0._10_4_;
  local_348._22_2_ = local_3b0._14_2_;
  local_348._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_3b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3b0._M_local_buf[0] = '\0';
  local_320[0]._0_8_ = CONCAT62(local_3d0._2_6_,100);
  local_328 = (index_pointer)0x1;
  local_3d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3d0[0] = 0;
  local_3e0.data_ = (AssertHelperData *)local_3d0;
  local_3c0 = (undefined1  [8])&local_3b0;
  local_350 = (undefined1  [8])pcVar3;
  local_330._M_p = (pointer)local_320;
  pstore::index::
  hamt_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
  ::insert_or_upsert<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)local_220,
             (hamt_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
              *)(this->super_DefaultIndexFixture).index_._M_t.
                super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
                ._M_head_impl,&local_258.super_transaction_base,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_350,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_p != local_320) {
    operator_delete(local_330._M_p,local_320[0]._M_allocated_capacity + 1);
  }
  if (local_350 != (undefined1  [8])pcVar3) {
    operator_delete((void *)local_350,
                    CONCAT62(local_348._10_6_,CONCAT11(local_348[9],local_348[8])) + 1);
  }
  if (local_3e0.data_ != (AssertHelperData *)local_3d0) {
    operator_delete(local_3e0.data_,
                    CONCAT62(local_3d0._2_6_,CONCAT11(local_3d0[1],local_3d0[0])) + 1);
  }
  if (local_3c0 != (undefined1  [8])&local_3b0) {
    operator_delete((void *)local_3c0,
                    CONCAT62(local_3b0._M_allocated_capacity._2_6_,
                             CONCAT11(local_3b0._M_local_buf[1],local_3b0._M_local_buf[0])) + 1);
  }
  ppVar1 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*((iterator_base<false> *)local_128);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)local_350,"\"a\"","key1",(char (*) [2])0x216b11,&ppVar1->first);
  if (local_350[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3c0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_348._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0xed,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3e0,(Message *)local_3c0);
    testing::internal::AssertHelper::~AssertHelper(&local_3e0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_3c0 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(size_type *)local_3c0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_348,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_348._0_8_);
  }
  local_3c0[0] = (internal)local_38;
  local_3b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 == false) {
    testing::Message::Message((Message *)&local_3e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_350,(internal *)local_3c0,(AssertionResult *)"itp1.second","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0xee,(char *)local_350);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if (local_350 != (undefined1  [8])pcVar3) {
      operator_delete((void *)local_350,
                      CONCAT62(local_348._10_6_,CONCAT11(local_348[9],local_348[8])) + 1);
    }
    if (local_3e0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3e0.data_ + 8))();
    }
    if (local_3b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3b8,local_3b8);
    }
  }
  ppVar1 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*((iterator_base<false> *)local_220);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)local_350,"\"c\"","key2",(char (*) [2])0x217cb6,&ppVar1->first);
  if (local_350[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3c0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_348._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0xf0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3e0,(Message *)local_3c0);
    testing::internal::AssertHelper::~AssertHelper(&local_3e0);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_3c0 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_3c0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_348,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_348._0_8_);
  }
  local_3c0[0] = (internal)local_130;
  local_3b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_130 == false) {
    testing::Message::Message((Message *)&local_3e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_350,(internal *)local_3c0,(AssertionResult *)"itp2.second","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0xf1,(char *)local_350);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if (local_350 != (undefined1  [8])pcVar3) {
      operator_delete((void *)local_350,
                      CONCAT62(local_348._10_6_,CONCAT11(local_348[9],local_348[8])) + 1);
    }
    if (local_3e0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3e0.data_ + 8))();
    }
    if (local_3b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3b8,local_3b8);
    }
  }
  this_00 = (this->super_DefaultIndexFixture).index_._M_t.
            super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
            ._M_head_impl;
  generation = pstore::database::get_current_revision((database *)local_358._M_p);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::flush(this_00,&local_258.super_transaction_base,generation);
  local_3d0[1] = 0;
  local_370[1] = kSuccess >> 8;
  local_3b0._M_local_buf[0] = 'c';
  local_3b0._M_local_buf[1] = '\0';
  local_3b0._M_allocated_capacity._2_6_ = local_3d0._2_6_;
  local_3b0._10_4_ = local_3d0._10_4_;
  local_3b0._14_2_ = local_3d0._14_2_;
  local_3b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_3d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3d0[0] = 0;
  local_390._M_allocated_capacity = CONCAT62(local_370._2_6_,0x66);
  local_390._8_8_ = local_370._8_8_;
  local_398 = 1;
  local_378 = 0;
  local_370[0] = kSuccess;
  local_3e0.data_ = (AssertHelperData *)local_3d0;
  local_3c0 = (undefined1  [8])&local_3b0;
  local_3a0._M_p = (pointer)&local_390;
  local_380.data_ = (AssertHelperData *)local_370;
  pstore::index::
  hamt_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
  ::insert_or_upsert<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)local_350,
             (hamt_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
              *)(this->super_DefaultIndexFixture).index_._M_t.
                super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
                ._M_head_impl,&local_258.super_transaction_base,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_3c0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_p != &local_390) {
    operator_delete(local_3a0._M_p,local_390._M_allocated_capacity + 1);
  }
  if (local_3c0 != (undefined1  [8])&local_3b0) {
    operator_delete((void *)local_3c0,
                    CONCAT62(local_3b0._M_allocated_capacity._2_6_,
                             CONCAT11(local_3b0._M_local_buf[1],local_3b0._M_local_buf[0])) + 1);
  }
  if (local_380.data_ != (AssertHelperData *)local_370) {
    operator_delete(local_380.data_,
                    CONCAT62(local_370._2_6_,CONCAT11(local_370[1],local_370[0])) + 1);
  }
  if (local_3e0.data_ != (AssertHelperData *)local_3d0) {
    operator_delete(local_3e0.data_,
                    CONCAT62(local_3d0._2_6_,CONCAT11(local_3d0[1],local_3d0[0])) + 1);
  }
  ppVar1 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*((iterator_base<false> *)local_350);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)local_3c0,"\"f\"","value",(char (*) [2])0x20a2de,&ppVar1->second);
  if (local_3c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3e0);
    if (local_3b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_3b8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0xf8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if (local_3e0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3e0.data_ + 8))();
    }
  }
  if (local_3b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3b8,local_3b8);
  }
  local_3e0.data_ = (AssertHelperData *)(CONCAT71(local_3e0.data_._1_7_,local_260) ^ 1);
  local_3d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_260 != false) {
    testing::Message::Message((Message *)&local_380);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3c0,(internal *)&local_3e0,(AssertionResult *)"itp3.second","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_370 + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0xf9,(char *)local_3c0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_370 + 0x10),(Message *)&local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_370 + 0x10));
    if (local_3c0 != (undefined1  [8])&local_3b0) {
      operator_delete((void *)local_3c0,
                      CONCAT62(local_3b0._M_allocated_capacity._2_6_,
                               CONCAT11(local_3b0._M_local_buf[1],local_3b0._M_local_buf[0])) + 1);
    }
    if (local_380.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_380.data_ + 8))();
    }
    if (local_3d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3d8,local_3d8);
    }
  }
  if ((_Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
       )local_268._M_head_impl !=
      (_Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
       )0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_268,local_268._M_head_impl);
  }
  if (local_138._M_t.
      super___uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .
      super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       )0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_138,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_138._M_t.
                    super___uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    .
                    super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
                    ._M_head_impl);
  }
  if (local_40._M_head_impl !=
      (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_40,local_40._M_head_impl);
  }
  local_258.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_0026b340
  ;
  pstore::transaction_base::rollback(&local_258.super_transaction_base);
  return;
}

Assistant:

TEST_F (DefaultIndexFixture, UpsertInternalStore) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    std::pair<default_index::iterator, bool> itp1 =
        index_->insert_or_assign (t1, std::make_pair ("a"s, "b"s));
    std::pair<default_index::iterator, bool> itp2 =
        index_->insert_or_assign (t1, std::make_pair ("c"s, "d"s));

    std::string const & key1 = (*itp1.first).first;
    EXPECT_EQ ("a", key1);
    EXPECT_TRUE (itp1.second);
    std::string const & key2 = (*itp2.first).first;
    EXPECT_EQ ("c", key2);
    EXPECT_TRUE (itp2.second);

    index_->flush (t1, db_.get_current_revision ());

    std::pair<default_index::iterator, bool> itp3 =
        index_->insert_or_assign (t1, std::make_pair ("c"s, "f"s));
    std::string & value = (*itp3.first).second;
    EXPECT_EQ ("f", value);
    EXPECT_FALSE (itp3.second);
}